

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
                  *this,Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *xpr,Index i)

{
  Scalar *pSVar1;
  Index IVar2;
  Index cols;
  EVP_PKEY_CTX *ctx;
  Index i_local;
  Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *xpr_local;
  BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
  *this_local;
  
  pSVar1 = TransposeImpl<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::data
                     ((TransposeImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)xpr);
  IVar2 = TransposeImpl<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::outerStride
                    ((TransposeImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)xpr);
  cols = Transpose<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols(xpr);
  MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
            ,pSVar1 + i * IVar2,1,cols);
  (this->m_xpr).m_matrix = xpr->m_matrix;
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,i);
  ctx = (EVP_PKEY_CTX *)0x0;
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startCol,0);
  init(this,ctx);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }